

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

BasicBlock * __thiscall spvtools::opt::Loop::FindConditionBlock(Loop *this)

{
  uint32_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Function *in_RAX;
  CFG *pCVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  BasicBlock *pBVar7;
  uint32_t *puVar8;
  Function *local_38;
  
  if (this->loop_merge_ == (BasicBlock *)0x0) {
    return (BasicBlock *)0x0;
  }
  local_38 = in_RAX;
  pCVar5 = IRContext::cfg(this->context_);
  uVar3 = BasicBlock::id(this->loop_merge_);
  pvVar6 = CFG::preds(pCVar5,uVar3);
  puVar1 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (puVar8 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    uVar4 = *puVar8;
    bVar2 = IsInsideLoop(this,uVar4);
    if ((bVar2) && (bVar2 = uVar3 != 0, uVar3 = uVar4, bVar2)) {
      return (BasicBlock *)0x0;
    }
  }
  if (uVar3 != 0) {
    pCVar5 = IRContext::cfg(this->context_);
    pBVar7 = CFG::block(pCVar5,uVar3);
    if ((pBVar7 != (BasicBlock *)0x0) &&
       (BasicBlock::ctail((BasicBlock *)&stack0xffffffffffffffc8),
       *(Op *)&(local_38->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
               sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase
       == OpBranchConditional)) {
      uVar3 = Instruction::GetSingleWordInOperand((Instruction *)local_38,1);
      uVar4 = BasicBlock::id(this->loop_merge_);
      if (uVar3 == uVar4) {
        return pBVar7;
      }
      uVar3 = Instruction::GetSingleWordInOperand((Instruction *)local_38,2);
      uVar4 = BasicBlock::id(this->loop_merge_);
      if (uVar3 == uVar4) {
        return pBVar7;
      }
    }
  }
  return (BasicBlock *)0x0;
}

Assistant:

BasicBlock* Loop::FindConditionBlock() const {
  if (!loop_merge_) {
    return nullptr;
  }
  BasicBlock* condition_block = nullptr;

  uint32_t in_loop_pred = 0;
  for (uint32_t p : context_->cfg()->preds(loop_merge_->id())) {
    if (IsInsideLoop(p)) {
      if (in_loop_pred) {
        // 2 in-loop predecessors.
        return nullptr;
      }
      in_loop_pred = p;
    }
  }
  if (!in_loop_pred) {
    // Merge block is unreachable.
    return nullptr;
  }

  BasicBlock* bb = context_->cfg()->block(in_loop_pred);

  if (!bb) return nullptr;

  const Instruction& branch = *bb->ctail();

  // Make sure the branch is a conditional branch.
  if (branch.opcode() != spv::Op::OpBranchConditional) return nullptr;

  // Make sure one of the two possible branches is to the merge block.
  if (branch.GetSingleWordInOperand(1) == loop_merge_->id() ||
      branch.GetSingleWordInOperand(2) == loop_merge_->id()) {
    condition_block = bb;
  }

  return condition_block;
}